

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O1

void dbg_text(char *tgt,int min,int max,int sd)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  byte *pbVar9;
  distribution *pdVar10;
  char *pcVar11;
  distribution *pdVar12;
  byte *pbVar13;
  char *pcVar14;
  distribution *target;
  char *pcVar15;
  long hgLength;
  long hgOffset;
  char syntax [13];
  char sentence [257];
  char acStack_1d5 [13];
  size_t sStack_1c8;
  uint *puStack_1c0;
  char *pcStack_1b8;
  byte *pbStack_1b0;
  ulong uStack_1a8;
  distribution *pdStack_1a0;
  ulong local_190;
  int local_188;
  int local_184;
  int local_180;
  uint local_17c;
  char *local_178;
  char *local_170;
  char *local_168;
  long local_160;
  distribution local_158;
  distribution local_138 [11];
  
  local_160 = 0;
  local_188 = sd;
  local_184 = min;
  local_180 = max;
  local_178 = tgt;
  if (dbg_text_bInit == '\0') {
    if (0 < verbose) {
      pdStack_1a0 = (distribution *)0x105e74;
      dbg_text_cold_1();
    }
    pcVar14 = dbg_text::szTextPool;
    local_190 = 0;
    pcVar11 = (char *)0x0;
LAB_00105b10:
    pdVar12 = local_138;
    local_170 = pcVar14;
    if ((0 < verbose) && ((long)(int)local_190 < (long)pcVar11)) {
      local_190 = (ulong)((int)local_190 + 200000);
      pdStack_1a0 = (distribution *)0x105dcd;
      fprintf(_stderr,"%3.0f%%\b\b\b\b",((double)(long)pcVar11 * 100.0) / 314572800.0);
    }
    pdVar10 = &grammar;
    pcVar14 = (char *)0x5;
    pbVar13 = (byte *)((long)&local_158.permute + 3);
    pdStack_1a0 = (distribution *)0x105b49;
    pick_str(&grammar,5,(char *)pbVar13);
    uVar3 = 0;
    sVar7 = 0;
    local_168 = pcVar11;
LAB_00105b52:
    pcVar15 = local_170;
    uStack_1a8 = (ulong)uVar3;
    pbVar9 = pbVar13;
    do {
      pbVar13 = pbVar9 + 1;
      bVar1 = *pbVar9;
      pbVar9 = pbVar13;
    } while (bVar1 == 0x20);
    switch(bVar1) {
    case 0x4e:
      pdStack_1a0 = (distribution *)0x105b7b;
      pdVar10 = pdVar12;
      uVar4 = txt_np((char *)pdVar12,(int)pcVar14);
      sVar7 = (size_t)uVar4;
      break;
    case 0x4f:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x55:
      break;
    case 0x50:
      pcVar14 = (char *)0x5;
      pdStack_1a0 = (distribution *)0x105c7b;
      iVar5 = pick_str(&prepositions,5,(char *)pdVar12);
      pdStack_1a0 = (distribution *)0x105c8f;
      sVar7 = strlen(prepositions.list[iVar5].text);
      pbVar9 = (byte *)((long)&pdVar12->count + (long)(int)sVar7);
      pdVar10 = (distribution *)(pbVar9 + 5);
      pbVar9[0] = 0x20;
      pbVar9[1] = 0x74;
      pbVar9[2] = 0x68;
      pbVar9[3] = 0x65;
      pbVar9[4] = 0x20;
      pbVar9[5] = 0;
      pdStack_1a0 = (distribution *)0x105cac;
      iVar5 = txt_np((char *)pdVar10,(int)pcVar14);
      sVar7 = (size_t)((int)sVar7 + iVar5 + 5);
      break;
    case 0x54:
      pdVar12 = (distribution *)((long)&pdVar12[-1].permute + 7);
      pcVar14 = (char *)0x5;
      pdStack_1a0 = (distribution *)0x105ccd;
      iVar5 = pick_str(&terminators,5,(char *)pdVar12);
      pdVar10 = (distribution *)terminators.list[iVar5].text;
      pdStack_1a0 = (distribution *)0x105ce1;
      sVar7 = strlen((char *)pdVar10);
      break;
    case 0x56:
      pdVar10 = &local_158;
      pdStack_1a0 = (distribution *)0x105bad;
      local_17c = uVar3;
      pick_str(&vp,5,(char *)pdVar10);
      pcVar14 = " ";
      pdStack_1a0 = (distribution *)0x105bbc;
      pcVar15 = strtok((char *)pdVar10," ");
      if (pcVar15 == (char *)0x0) {
        sVar7 = 0;
        pcVar11 = local_168;
        uVar3 = local_17c;
      }
      else {
        sVar7 = 0;
        target = pdVar12;
        do {
          cVar2 = *pcVar15;
          if (cVar2 == 'X') {
            pdVar10 = &auxillaries;
          }
          else if (cVar2 == 'V') {
            pdVar10 = &verbs;
          }
          else if (cVar2 == 'D') {
            pdVar10 = &adverbs;
          }
          else {
            pdVar10 = (distribution *)0x0;
          }
          pdStack_1a0 = (distribution *)0x105c0f;
          iVar5 = pick_str(pdVar10,5,(char *)target);
          pdStack_1a0 = (distribution *)0x105c24;
          sVar6 = strlen(pdVar10->list[iVar5].text);
          pbVar9 = (byte *)((long)&target->count + (long)(int)sVar6);
          iVar5 = (int)sVar7 + (int)sVar6;
          if (pcVar15[1] != 0) {
            iVar5 = iVar5 + 1;
            pbVar9[1] = pcVar15[1];
            pbVar9 = pbVar9 + 1;
          }
          *pbVar9 = 0x20;
          target = (distribution *)(pbVar9 + 1);
          sVar7 = (size_t)(iVar5 + 1);
          pdVar10 = (distribution *)0x0;
          pcVar14 = " ";
          pdStack_1a0 = (distribution *)0x105c53;
          pcVar15 = strtok((char *)0x0," ");
          pcVar11 = local_168;
          uVar3 = local_17c;
        } while (pcVar15 != (char *)0x0);
      }
      break;
    default:
      if (bVar1 == 0) goto LAB_00105d1c;
    }
    pdVar12 = (distribution *)((long)&pdVar12->count + (long)(int)sVar7);
    uVar3 = (int)sVar7 + uVar3;
    if ((*pbVar13 & 0xdf) != 0) {
      uVar3 = uVar3 + 1;
      *(byte *)((long)&pdVar12->count + 1) = *pbVar13;
      pdVar12 = (distribution *)((long)&pdVar12->count + 1);
    }
    goto LAB_00105b52;
  }
LAB_00105dfe:
  iVar5 = local_180;
  lVar8 = (long)local_188;
  pdStack_1a0 = (distribution *)0x105e23;
  dss_random((long *)&local_158,0,(long)(0x12c00000 - local_180),lVar8);
  pdStack_1a0 = (distribution *)0x105e3b;
  dss_random(&local_160,(long)local_184,(long)iVar5,lVar8);
  lVar8 = local_160;
  pcVar11 = local_178;
  pdStack_1a0 = (distribution *)0x105e58;
  strncpy(local_178,dbg_text::szTextPool + local_158._0_8_,(long)(int)local_160);
  pcVar11[lVar8] = '\0';
  return;
LAB_00105d1c:
  *(byte *)&pdVar12->count = 0;
  if ((int)uVar3 < 1) {
    pdStack_1a0 = (distribution *)txt_np;
    dbg_text_cold_2();
    puStack_1c0 = &switchD_00105b71::switchdataD_00107ac8;
    sStack_1c8 = sVar7;
    pcStack_1b8 = pcVar11;
    pbStack_1b0 = pbVar13;
    pdStack_1a0 = pdVar12;
    pick_str(&np,5,acStack_1d5);
    pbVar13 = (byte *)strtok(acStack_1d5," ");
    while (pbVar13 != (byte *)0x0) {
      bVar1 = *pbVar13;
      if (bVar1 < 0x4a) {
        if (bVar1 == 0x41) {
          pdVar12 = &articles;
        }
        else {
          pdVar12 = (distribution *)0x0;
          if (bVar1 == 0x44) {
            pdVar12 = &adverbs;
          }
        }
      }
      else if (bVar1 == 0x4a) {
        pdVar12 = &adjectives;
      }
      else {
        pdVar12 = (distribution *)0x0;
        if (bVar1 == 0x4e) {
          pdVar12 = &nouns;
        }
      }
      iVar5 = pick_str(pdVar12,5,(char *)pdVar10);
      sVar7 = strlen(pdVar12->list[iVar5].text);
      pbVar9 = (byte *)((long)&pdVar10->count + (long)(int)sVar7);
      if (pbVar13[1] != 0) {
        *pbVar9 = pbVar13[1];
        pbVar9 = pbVar9 + 1;
      }
      *pbVar9 = 0x20;
      pdVar10 = (distribution *)(pbVar9 + 1);
      pbVar13 = (byte *)strtok((char *)0x0," ");
    }
    return;
  }
  lVar8 = (long)(int)uVar3 + -1;
  pcVar14 = dbg_text::szTextPool +
            (long)(dbg_text::szTextPool +
                  (long)(dbg_text::szTextPool +
                        (long)(dbg_text::szTextPool + (0x127c5f40 - (long)pcVar11))));
  if (lVar8 < (long)pcVar14) {
    pdStack_1a0 = (distribution *)0x105d52;
    strcpy(local_170,(char *)local_138);
    pcVar11 = pcVar11 + (int)uVar3;
    pcVar15 = pcVar15 + lVar8;
    pcVar14 = pcVar15 + 1;
    *pcVar15 = ' ';
  }
  else {
    (&stack0x12af1698)[(long)(pcVar14 + -0x12af17d0)] = 0;
    pdStack_1a0 = (distribution *)0x105d76;
    strcpy(local_170,(char *)local_138);
    pcVar14 = pcVar15 + (long)pcVar14;
    pcVar11 = dbg_text::szTextPool + 0x12af17d0;
  }
  if (0x12bfffff < (long)pcVar11) goto LAB_00105dd2;
  goto LAB_00105b10;
LAB_00105dd2:
  *pcVar14 = '\0';
  dbg_text_bInit = '\x01';
  if (0 < verbose) {
    pdStack_1a0 = (distribution *)0x105dfe;
    fputc(10,_stderr);
  }
  goto LAB_00105dfe;
}

Assistant:

void
dbg_text(char *tgt, int min, int max, int sd)
{
   DSS_HUGE hgLength = 0,
      hgOffset,
      wordlen = 0,
      s_len,
      needed;
   char sentence[MAX_SENT_LEN + 1],
      *cp;
   static char szTextPool[TEXT_POOL_SIZE + 1];
   static int bInit = 0;
   int nLifeNoise = 0;
   
   if (!bInit)
   {
      cp = &szTextPool[0];
      if (verbose > 0)
         fprintf(stderr, "\nPreloading text ... ");
      
      while (wordlen < TEXT_POOL_SIZE)
      {
         if ((verbose > 0) && (wordlen > nLifeNoise))
         {
            nLifeNoise += 200000;
            fprintf(stderr, "%3.0f%%\b\b\b\b", (100.0 * wordlen)/TEXT_POOL_SIZE);
         }
         
         s_len = txt_sentence(sentence, 5);
         if ( s_len < 0)
            INTERNAL_ERROR("Bad sentence formation");
         needed = TEXT_POOL_SIZE - wordlen;
         if (needed >= (s_len + 1))	/* need the entire sentence */
         {
            strcpy(cp, sentence);
            cp += s_len;
            wordlen += s_len + 1;
            *(cp++) = ' ';
         }
         else /* chop the new sentence off to match the length target */
         {
            sentence[needed] = '\0';
            strcpy(cp, sentence);
            wordlen += needed;
            cp += needed;
         }
      }
      *cp = '\0';
      bInit = 1;
      if (verbose > 0)
         fprintf(stderr, "\n");
   }

   RANDOM(hgOffset, 0, TEXT_POOL_SIZE - max, sd);
   RANDOM(hgLength, min, max, sd);
   strncpy(&tgt[0], &szTextPool[hgOffset], (int)hgLength);
   tgt[hgLength] = '\0';

	return;
}